

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureAttachmentTest::SubTestContent
          (TextureAttachmentTest *this,GLenum attachment,GLenum texture_target,GLenum internalformat
          ,GLuint level,GLuint levels)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  long lVar5;
  float fVar6;
  float fVar7;
  GLfloat color [4];
  GLfloat depth;
  undefined1 local_1e8 [8];
  undefined8 uStack_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  if ((int)internalformat < 0x88f0) {
    if (internalformat == 0x8058) {
      local_1e8 = (undefined1  [8])0x0;
      uStack_1e0._0_4_ = 0.0;
      uStack_1e0._4_4_ = 0.0;
      lVar5 = 0;
      (**(code **)(lVar4 + 0x1220))(0,0,1,1,0x1908,0x1406,local_1e8);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glReadPixels has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x26f);
      while( true ) {
        fVar6 = *(float *)((long)&s_reference_color + lVar5) - *(float *)(local_1e8 + lVar5);
        fVar7 = -fVar6;
        if (-fVar6 <= fVar6) {
          fVar7 = fVar6;
        }
        if (0.0625 < fVar7) break;
        lVar5 = lVar5 + 4;
        if (lVar5 == 0x10) {
          return true;
        }
      }
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Named Framebuffer Texture Layer Attachment test failed with ",
                 0x3c);
      local_1d0.m_getName = glu::getTextureTargetName;
      local_1d0.m_value = texture_target;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," texture set up as ",0x13);
      local_1c0.m_getName = glu::getFramebufferAttachmentName;
      local_1c0.m_value = attachment;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," attachment and texture level ",0x1e);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," of texture with ",0x11)
      ;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," levels. The color content of the framebuffer was [",0x33);
      std::ostream::_M_insert<double>((double)(float)local_1e8._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<double>((double)(float)local_1e8._4_4_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<double>((double)(float)uStack_1e0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<double>((double)uStack_1e0._4_4_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], but [",8);
      std::ostream::_M_insert<double>(0.25);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<double>(0.5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<double>(0.75);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<double>(1.0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] was expected.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00aa3124;
    }
    if (internalformat != 0x81a6) {
      return true;
    }
LAB_00aa2c0e:
    local_1d0.m_getName = (GetNameFunc)((ulong)local_1d0.m_getName & 0xffffffff00000000);
    (**(code **)(lVar4 + 0x1220))(0,0,1,1,0x1902,0x1406,&local_1d0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glReadPixels has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x289);
    fVar6 = 0.5 - local_1d0.m_getName._0_4_;
    fVar7 = -fVar6;
    if (-fVar6 <= fVar6) {
      fVar7 = fVar6;
    }
    if (0.0625 < fVar7) {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Named Framebuffer Texture Layer Attachment test failed ",0x37);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"with texture set up as ",0x17);
      local_1e8 = (undefined1  [8])glu::getFramebufferAttachmentName;
      uStack_1e0._0_4_ = (float)attachment;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_1e8,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," attachment and texture level ",0x1e);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," of texture with ",0x11)
      ;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," levels. The depth content of the framebuffer was [",0x33);
      std::ostream::_M_insert<double>((double)local_1d0.m_getName._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], but [",8);
      std::ostream::_M_insert<double>(0.5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] was expected.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00aa3124;
    }
    if ((internalformat != 0x8d48) && (internalformat != 0x88f0)) {
      return true;
    }
  }
  else {
    if (internalformat == 0x88f0) goto LAB_00aa2c0e;
    if (internalformat != 0x8d48) {
      return true;
    }
  }
  local_1d0.m_getName = (GetNameFunc)((ulong)local_1d0.m_getName & 0xffffffff00000000);
  (**(code **)(lVar4 + 0x1220))(0,0,1,1,0x1901,0x1404,&local_1d0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x29e);
  if (local_1d0.m_getName._0_4_ == 9.80909e-45) {
    return true;
  }
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Named Framebuffer Texture Layer Attachment test failed ",0x37);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"with texture set up as ",0x17);
  local_1e8 = (undefined1  [8])glu::getFramebufferAttachmentName;
  uStack_1e0._0_4_ = (float)attachment;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_1e8,(ostream *)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1," attachment and texture level ",0x1e);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," of texture with ",0x11);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1," levels. The stencil content of the framebuffer was [",0x35);
  std::ostream::operator<<(poVar1,(int)local_1d0.m_getName._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], but [",8);
  std::ostream::operator<<(poVar1,7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] was expected.",0xf);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00aa3124:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool TextureAttachmentTest::SubTestContent(glw::GLenum attachment, glw::GLenum texture_target,
										   glw::GLenum internalformat, glw::GLuint level, glw::GLuint levels)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check framebuffer's color content. */
	if (GL_RGBA8 == internalformat)
	{
		glw::GLfloat color[4] = { 0.f };

		gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_FLOAT, color);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

		for (int i = 0; i < 4 /* color components */; ++i)
		{
			if (de::abs(s_reference_color[i] - color[i]) > 0.0625 /* precision */)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Named Framebuffer Texture Layer Attachment test failed with "
					<< glu::getTextureTargetStr(texture_target) << " texture set up as "
					<< glu::getFramebufferAttachmentStr(attachment) << " attachment and texture level " << level
					<< " of texture with " << levels << " levels. The color content of the framebuffer was ["
					<< color[0] << ", " << color[1] << ", " << color[2] << ", " << color[3] << "], but ["
					<< s_reference_color[0] << ", " << s_reference_color[1] << ", " << s_reference_color[2] << ", "
					<< s_reference_color[3] << "] was expected." << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	/* Check framebuffer's depth content. */
	if ((GL_DEPTH_COMPONENT24 == internalformat) || (GL_DEPTH24_STENCIL8 == internalformat))
	{
		glw::GLfloat depth = 0.f;

		gl.readPixels(0, 0, 1, 1, GL_DEPTH_COMPONENT, GL_FLOAT, &depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

		if (de::abs(s_reference_depth - depth) > 0.0625 /* precision */)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Named Framebuffer Texture Layer Attachment test failed "
				<< "with texture set up as " << glu::getFramebufferAttachmentStr(attachment)
				<< " attachment and texture level " << level << " of texture with " << levels
				<< " levels. The depth content of the framebuffer was [" << depth << "], but [" << s_reference_depth
				<< "] was expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	/* Check framebuffer's stencil content. */
	if ((GL_STENCIL_INDEX8 == internalformat) || (GL_DEPTH24_STENCIL8 == internalformat))
	{
		glw::GLint stencil = 0;

		gl.readPixels(0, 0, 1, 1, GL_STENCIL_INDEX, GL_INT, &stencil);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

		if (s_reference_stencil != stencil)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Named Framebuffer Texture Layer Attachment test failed "
				<< "with texture set up as " << glu::getFramebufferAttachmentStr(attachment)
				<< " attachment and texture level " << level << " of texture with " << levels
				<< " levels. The stencil content of the framebuffer was [" << stencil << "], but ["
				<< s_reference_stencil << "] was expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}